

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O3

void __thiscall
serialize_tests::Base::
Serialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
          (Base *this,
          ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>
          *s)

{
  DataStream *pDVar1;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s_00;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (s->m_params->m_base_format == RAW) {
    local_38._M_dataplus._M_p._0_1_ = this->m_base_data;
    pDVar1 = (s->m_substream).m_substream.m_substream;
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)pDVar1,
               (pDVar1->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_38);
  }
  else {
    s_00.m_size = 1;
    s_00.m_data = &this->m_base_data;
    HexStr_abi_cxx11_(&local_38,s_00);
    pDVar1 = (s->m_substream).m_substream.m_substream;
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)pDVar1,
               (pDVar1->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               CONCAT71(local_38._M_dataplus._M_p._1_7_,(uint8_t)local_38._M_dataplus._M_p),
               local_38._M_string_length +
               CONCAT71(local_38._M_dataplus._M_p._1_7_,(uint8_t)local_38._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(uint8_t)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(uint8_t)local_38._M_dataplus._M_p),
                      local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        if (s.template GetParams<BaseFormat>().m_base_format == BaseFormat::RAW) {
            s << m_base_data;
        } else {
            s << Span{HexStr(Span{&m_base_data, 1})};
        }
    }